

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

bool CoreML::Specification::operator==
               (RepeatedPtrField<CoreML::Specification::SparseVector> *a,
               RepeatedPtrField<CoreML::Specification::SparseVector> *b)

{
  bool bVar1;
  Type *pTVar2;
  Type *pTVar3;
  int iVar4;
  
  iVar4 = (a->super_RepeatedPtrFieldBase).current_size_;
  if (iVar4 != (b->super_RepeatedPtrFieldBase).current_size_) {
    return false;
  }
  if (0 < iVar4) {
    iVar4 = 0;
    do {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SparseVector>::TypeHandler>
                         (&a->super_RepeatedPtrFieldBase,iVar4);
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SparseVector>::TypeHandler>
                         (&b->super_RepeatedPtrFieldBase,iVar4);
      bVar1 = operator==(&pTVar2->nodes_,&pTVar3->nodes_);
      if (!bVar1) {
        return bVar1;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < (a->super_RepeatedPtrFieldBase).current_size_);
    return bVar1;
  }
  return true;
}

Assistant:

inline int RepeatedPtrFieldBase::size() const { return current_size_; }